

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

Matrix * __thiscall Matrix::transpose(Matrix *this)

{
  value_type vVar1;
  reference pvVar2;
  reference pvVar3;
  uint local_38;
  uint local_34;
  uint j;
  uint i;
  Matrix transposed;
  Matrix *this_local;
  
  transposed.m_shape.field_0 = (anon_union_8_2_1e237852_for_Shape_0)this;
  Matrix((Matrix *)&j,(this->m_shape).field_0.m_dims[1],(this->m_shape).field_0.m_dims[0]);
  for (local_34 = 0; local_34 < (this->m_shape).field_0.m_dims[1]; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < (this->m_shape).field_0.m_dims[0]; local_38 = local_38 + 1) {
      pvVar2 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[](&this->m_vals,(ulong)local_38);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,(ulong)local_34);
      vVar1 = *pvVar3;
      pvVar2 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)&j,(ulong)local_34);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar2,(ulong)local_38);
      *pvVar3 = vVar1;
    }
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=(&this->m_vals,
              (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)&j);
  ~Matrix((Matrix *)&j);
  return this;
}

Assistant:

Matrix& Matrix::transpose(){
    Matrix transposed(m_shape.n_col, m_shape.n_row);
    // double tmp;

    for(uint i=0;i<m_shape.n_col;++i){
        for(uint j=0;j<m_shape.n_row;++j){
            // tmp=m_vals[i][j];
            transposed.m_vals[i][j]=m_vals[j][i];
        }
    }
    m_vals=transposed.m_vals;

    return *this;
}